

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptInterpreter.cpp
# Opt level: O3

void __thiscall MiniScript::Interpreter::Interpreter(Interpreter *this,String *source)

{
  long *plVar1;
  String local_30;
  
  this->_vptr_Interpreter = (_func_int **)&PTR_ReportError_001bf648;
  this->parser = (Parser *)0x0;
  this->standardOutput = (TextOutputMethod)0x0;
  this->implicitOutput = (TextOutputMethod)0x0;
  this->errorOutput = (TextOutputMethod)0x0;
  this->hostData = (void *)0x0;
  this->vm = (Machine *)0x0;
  (this->source).ss = (StringStorage *)0x0;
  (this->source).isTemp = false;
  local_30.isTemp = false;
  local_30.ss = source->ss;
  if (local_30.ss != (StringStorage *)0x0) {
    plVar1 = &((local_30.ss)->super_RefCountedStorage).refCount;
    *plVar1 = *plVar1 + 1;
  }
  String::operator=(&this->source,&local_30);
  this->parser = (Parser *)0x0;
  this->vm = (Machine *)0x0;
  if ((local_30.ss != (StringStorage *)0x0) && (local_30.isTemp == false)) {
    plVar1 = &((local_30.ss)->super_RefCountedStorage).refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*((local_30.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
    }
  }
  return;
}

Assistant:

Interpreter::Interpreter(String source) : standardOutput(nullptr), errorOutput(nullptr), implicitOutput(nullptr),
	parser(nullptr), vm(nullptr), hostData(nullptr) {
		Reset(source);
	}